

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O0

bool ApprovalTests::TestName::registerRootDirectoryFromMainFile(string *file)

{
  ostream *poVar1;
  ulong uVar2;
  runtime_error *this;
  string *psVar3;
  string *in_RDI;
  string adjustedPath;
  string local_58 [32];
  string *in_stack_ffffffffffffffc8;
  
  poVar1 = ::std::operator<<((ostream *)&::std::cout,
                             "TestName::registerRootDirectoryFromMainFile from __FILE__ ");
  poVar1 = ::std::operator<<(poVar1,in_RDI);
  ::std::operator<<(poVar1,'\n');
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ::std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,in_RDI);
    poVar1 = ::std::operator<<((ostream *)&::std::cout,
                               "TestName::registerRootDirectoryFromMainFile found parent  ");
    poVar1 = ::std::operator<<(poVar1,(string *)&stack0xffffffffffffffc8);
    ::std::operator<<(poVar1,'\n');
    FileUtils::getDirectory(in_stack_ffffffffffffffc8);
    psVar3 = rootDirectoryStorage_abi_cxx11_();
    ::std::__cxx11::string::operator=((string *)psVar3,local_58);
    ::std::__cxx11::string::~string(local_58);
    poVar1 = ::std::operator<<((ostream *)&::std::cout,
                               "TestName::registerRootDirectoryFromMainFile result        ");
    psVar3 = rootDirectoryStorage_abi_cxx11_();
    poVar1 = ::std::operator<<(poVar1,(string *)psVar3);
    ::std::operator<<(poVar1,'\n');
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    return true;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this,"Cannot register an empty path as root directory");
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool TestName::registerRootDirectoryFromMainFile(const std::string& file)
    {
        std::cout << "TestName::registerRootDirectoryFromMainFile from __FILE__ " << file
                  << '\n';

        if (file.empty())
        {
            throw std::runtime_error("Cannot register an empty path as root directory");
        }

        std::string adjustedPath = file;
        std::cout << "TestName::registerRootDirectoryFromMainFile found parent  "
                  << adjustedPath << '\n';

        rootDirectoryStorage() = FileUtils::getDirectory(adjustedPath);
        std::cout << "TestName::registerRootDirectoryFromMainFile result        "
                  << rootDirectoryStorage() << '\n';

        return true;
    }